

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O3

vec3 * __thiscall Sphere::intersect(Sphere *this,shared_ptr<Ray> *ray)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
  left;
  anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
  left_00;
  anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
  right;
  vec4 *pvVar6;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 *paVar7;
  vec3 *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  float fVar11;
  float fVar12;
  vec4 left_01;
  vec4 right_00;
  vec4 right_01;
  
  pvVar6 = Ray::getOrigin((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  fVar11 = (pvVar6->field_0).field_0.x;
  fVar12 = (pvVar6->field_0).field_0.y;
  fVar1 = (pvVar6->field_0).field_0.z;
  fVar2 = (pvVar6->field_0).field_0.w;
  paVar7 = &Ray::getDirection((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            field_0;
  uVar10 = CONCAT44(fVar12 - (this->super_Obj).position.field_0.field_0.y,
                    fVar11 - (this->super_Obj).position.field_0.field_0.x);
  uVar9 = CONCAT44(fVar2 - (this->super_Obj).position.field_0.field_0.w,
                   fVar1 - (this->super_Obj).position.field_0.field_0.z);
  right = paVar7->field_0;
  left_00 = paVar7->field_0;
  left = paVar7->field_0;
  left_01.field_0._8_8_ = uVar9;
  left_01.field_0._0_8_ = uVar10;
  right_00.field_0._8_8_ = uVar9;
  right_00.field_0._0_8_ = uVar10;
  dVar3 = Obj::dot(left_01,right_00);
  right_01.field_0._8_8_ = uVar9;
  right_01.field_0._0_8_ = uVar10;
  dVar4 = Obj::dot((vec4)left,right_01);
  fVar11 = (float)(dVar4 + dVar4);
  dVar4 = this->radius;
  dVar5 = Obj::dot((vec4)left_00,(vec4)right);
  fVar12 = fVar11 * fVar11 + (float)dVar5 * -4.0 * (float)((double)(float)dVar3 - dVar4 * dVar4);
  if (0.0 <= fVar12) {
    fVar12 = ((fVar12 + fVar11) * -0.5) / (float)dVar5;
    pvVar6 = Ray::getDirection((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    uVar9 = *(undefined8 *)&pvVar6->field_0;
    fVar11 = (pvVar6->field_0).field_0.z;
    pvVar6 = Ray::getOrigin((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if (0.0 < fVar12) {
      fVar1 = (pvVar6->field_0).field_0.z;
      pvVar8 = (vec3 *)operator_new(0xc);
      *(ulong *)&pvVar8->field_0 =
           CONCAT44(fVar12 * (float)((ulong)uVar9 >> 0x20) +
                    (float)((ulong)*(undefined8 *)&pvVar6->field_0 >> 0x20),
                    fVar12 * (float)uVar9 + (float)*(undefined8 *)&pvVar6->field_0);
      (pvVar8->field_0).field_0.z = fVar11 * fVar12 + fVar1;
      return pvVar8;
    }
  }
  return (vec3 *)0x0;
}

Assistant:

glm::vec3* Sphere::intersect(std::shared_ptr<Ray> ray) {

    glm::vec4 origin = ray->getOrigin();
    glm::vec4 direction = ray->getDirection();

    glm::normalize(direction);
    glm::vec4 op = origin - position;
    float dotOp = dot(op,op);


    float b = 2.f * (dot(direction, op));
    float c = dotOp - radius * radius;

    float a = dot(direction, direction);

    float discriminant = b * b - 4  *  a * c ;
    if(discriminant < 0){
        return nullptr;
        }

    double t = (-0.5f) * (b + discriminant) / a;

    glm::vec3 d = glm::vec3 (ray->getDirection());
    glm::vec3 o= glm::vec3 (ray->getOrigin());
    if (t > 0.0f) {
        glm::vec3* hitpoint =  new glm::vec3(o.x + d.x * t, o.y + d.y * t, o.z + d.z * t);
        return hitpoint;
    }
    else
    return nullptr;

}